

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultipleShootingSolver.cpp
# Opt level: O0

void __thiscall
iDynTree::optimalcontrol::MultipleShootingSolver::MultipleShootingTranscription::addMeshPoint
          (MultipleShootingTranscription *this,MeshPoint *newMeshPoint)

{
  bool bVar1;
  iterator iVar2;
  anon_struct_112_6_78b70dfe *in_RSI;
  anon_struct_112_6_78b70dfe *in_RDI;
  vector<iDynTree::optimalcontrol::MeshPoint,_std::allocator<iDynTree::optimalcontrol::MeshPoint>_>
  *in_stack_ffffffffffffffc8;
  value_type *__x;
  vector<iDynTree::optimalcontrol::MeshPoint,_std::allocator<iDynTree::optimalcontrol::MeshPoint>_>
  *in_stack_ffffffffffffffe0;
  
  __x = (value_type *)&in_RDI[1].origin.m_description._M_string_length;
  std::
  vector<iDynTree::optimalcontrol::MeshPoint,_std::allocator<iDynTree::optimalcontrol::MeshPoint>_>
  ::end(in_stack_ffffffffffffffc8);
  bVar1 = __gnu_cxx::operator==
                    ((__normal_iterator<iDynTree::optimalcontrol::MeshPoint_*,_std::vector<iDynTree::optimalcontrol::MeshPoint,_std::allocator<iDynTree::optimalcontrol::MeshPoint>_>_>
                      *)in_RDI,
                     (__normal_iterator<iDynTree::optimalcontrol::MeshPoint_*,_std::vector<iDynTree::optimalcontrol::MeshPoint,_std::allocator<iDynTree::optimalcontrol::MeshPoint>_>_>
                      *)in_stack_ffffffffffffffc8);
  if (bVar1) {
    std::
    vector<iDynTree::optimalcontrol::MeshPoint,_std::allocator<iDynTree::optimalcontrol::MeshPoint>_>
    ::push_back(in_stack_ffffffffffffffe0,__x);
    iVar2 = std::
            vector<iDynTree::optimalcontrol::MeshPoint,_std::allocator<iDynTree::optimalcontrol::MeshPoint>_>
            ::end(in_stack_ffffffffffffffc8);
    in_RDI[1].origin.m_description._M_string_length = (size_type)iVar2._M_current;
  }
  else {
    __gnu_cxx::
    __normal_iterator<iDynTree::optimalcontrol::MeshPoint_*,_std::vector<iDynTree::optimalcontrol::MeshPoint,_std::allocator<iDynTree::optimalcontrol::MeshPoint>_>_>
    ::operator*((__normal_iterator<iDynTree::optimalcontrol::MeshPoint_*,_std::vector<iDynTree::optimalcontrol::MeshPoint,_std::allocator<iDynTree::optimalcontrol::MeshPoint>_>_>
                 *)&in_RDI[1].origin.m_description._M_string_length);
    anon_struct_112_6_78b70dfe::operator=(in_RDI,in_RSI);
    __gnu_cxx::
    __normal_iterator<iDynTree::optimalcontrol::MeshPoint_*,_std::vector<iDynTree::optimalcontrol::MeshPoint,_std::allocator<iDynTree::optimalcontrol::MeshPoint>_>_>
    ::operator++((__normal_iterator<iDynTree::optimalcontrol::MeshPoint_*,_std::vector<iDynTree::optimalcontrol::MeshPoint,_std::allocator<iDynTree::optimalcontrol::MeshPoint>_>_>
                  *)&in_RDI[1].origin.m_description._M_string_length);
  }
  return;
}

Assistant:

void addMeshPoint(MeshPoint& newMeshPoint){
                if (m_meshPointsEnd == m_meshPoints.end()){
                    m_meshPoints.push_back(newMeshPoint);
                    m_meshPointsEnd = m_meshPoints.end();
                } else {
                    *m_meshPointsEnd = newMeshPoint;
                    ++m_meshPointsEnd;
                }
            }